

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

Matrix<Complex> __thiscall Matrix<Complex>::fromNumber(Matrix<Complex> *this,Complex *f)

{
  Complex *this_00;
  Complex *extraout_RDX;
  Matrix<Complex> MVar1;
  
  Matrix(this,1,1);
  this_00 = this->arr;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)f);
  (this_00->_re)._numerator.negative = (f->_re)._numerator.negative;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this_00->_re)._denominator.digits,&(f->_re)._denominator.digits);
  (this_00->_re)._denominator.negative = (f->_re)._denominator.negative;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this_00->_im,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&f->_im);
  (this_00->_im)._numerator.negative = (f->_im)._numerator.negative;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this_00->_im)._denominator.digits,&(f->_im)._denominator.digits);
  (this_00->_im)._denominator.negative = (f->_im)._denominator.negative;
  MVar1.arr = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

inline static const Matrix fromNumber(Field f)
    {
        Matrix a(1, 1);
        a[0][0] = f;
        return a;
    }